

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

void __thiscall
t_html_generator::detect_input_encoding(t_html_generator *this,string *str,size_t firstpos)

{
  input_type iVar1;
  bool bVar2;
  
  bVar2 = is_utf8_sequence(this,str,firstpos);
  if (bVar2) {
    pdebug("Input seems to be already UTF-8 encoded");
    iVar1 = INPUT_UTF8;
  }
  else {
    pwarning(1,"Input is not UTF-8, treating as plain ANSI");
    iVar1 = INPUT_PLAIN;
  }
  this->input_type_ = iVar1;
  return;
}

Assistant:

void t_html_generator::detect_input_encoding(std::string const& str, size_t firstpos) {
  if (is_utf8_sequence(str, firstpos)) {
    pdebug("Input seems to be already UTF-8 encoded");
    input_type_ = INPUT_UTF8;
    return;
  }

  // fallback
  pwarning(1, "Input is not UTF-8, treating as plain ANSI");
  input_type_ = INPUT_PLAIN;
}